

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::x86::Assembler::align(Assembler *this,uint32_t alignMode,uint32_t alignment)

{
  CodeHolder *this_00;
  Section *pSVar1;
  Logger *pLVar2;
  byte bVar3;
  Error extraout_EAX;
  Error EVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *__s;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  ulong uVar14;
  StringTmp<128UL> sb;
  anon_union_32_4_a21e1b61_for_String_0 local_d8;
  char local_b8 [136];
  
  this_00 = (this->super_BaseAssembler).super_BaseEmitter._code;
  if (this_00 == (CodeHolder *)0x0) {
    EVar4 = 5;
  }
  else {
    uVar14 = (ulong)alignMode;
    if (alignMode < 3) {
      if (alignment < 2) {
        return 0;
      }
      if ((alignment < 0x41) &&
         (uVar6 = alignment - (alignment >> 1 & 0x55555555),
         uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333),
         ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
        __s = (this->super_BaseAssembler)._bufferPtr;
        lVar5 = (long)__s - (long)(this->super_BaseAssembler)._bufferData;
        uVar12 = (-(ulong)alignment & (ulong)alignment + 0xffffffff + lVar5) - lVar5;
        if ((int)uVar12 == 0) {
LAB_0012a700:
          pLVar2 = (this->super_BaseAssembler).super_BaseEmitter._logger;
          if (pLVar2 == (Logger *)0x0) {
            return 0;
          }
          local_d8._large.data = local_b8;
          local_d8._large.size = 0;
          local_d8._0_8_ = 0x20;
          local_d8._large.capacity = 0x87;
          local_b8[0] = '\0';
          String::_opChars((String *)&local_d8._small,1,' ',
                           (ulong)(pLVar2->_options)._indentation[0]);
          String::_opFormat((String *)&local_d8._small,1,"align %u\n",(ulong)alignment);
          pLVar2 = (this->super_BaseAssembler).super_BaseEmitter._logger;
          uVar8 = local_d8._large.size;
          uVar9 = local_d8._large.data;
          if ((local_d8._0_8_ & 0xff) < 0x1f) {
            uVar8 = local_d8._0_8_ & 0xff;
            uVar9 = local_d8._small.data;
          }
          (*pLVar2->_vptr_Logger[2])(pLVar2,uVar9,uVar8);
          String::reset((String *)&local_d8._small);
          return 0;
        }
        if ((ulong)((long)(this->super_BaseAssembler)._bufferEnd - (long)__s) <
            (uVar12 & 0xffffffff)) {
          EVar4 = CodeHolder::growBuffer
                            (this_00,&((this->super_BaseAssembler)._section)->_buffer,
                             uVar12 & 0xffffffff);
          if (EVar4 != 0) goto LAB_0012a7f1;
          __s = (this->super_BaseAssembler)._bufferPtr;
        }
        do {
          if ((int)uVar14 == 1) {
            bVar3 = 0xcc;
LAB_0012a6c4:
            uVar14 = uVar12 & 0xffffffff;
            memset(__s,(uint)bVar3,uVar14);
            __s = __s + uVar14;
          }
          else {
            if ((int)uVar14 != 0) {
              bVar3 = 0;
              goto LAB_0012a6c4;
            }
            bVar3 = 0x90;
            if (((this->super_BaseAssembler).super_BaseEmitter._encodingOptions & 2) == 0)
            goto LAB_0012a6c4;
            do {
              puVar13 = __s;
              uVar11 = (uint)uVar12;
              uVar6 = 9;
              if (uVar11 < 9) {
                uVar6 = uVar11;
              }
              uVar10 = uVar11;
              if (8 < (uVar12 & 0xffffffff)) {
                uVar10 = 9;
              }
              lVar5 = 0;
              do {
                puVar13[lVar5] = align::nopData[uVar6 - 1][lVar5];
                lVar5 = lVar5 + 1;
              } while (uVar10 != (uint)lVar5);
              uVar12 = (ulong)(uVar11 - uVar6);
              __s = puVar13 + lVar5;
            } while (uVar11 - uVar6 != 0);
            __s = puVar13 + lVar5;
          }
          pSVar1 = (this->super_BaseAssembler)._section;
          uVar7 = (long)__s - (long)(this->super_BaseAssembler)._bufferData;
          if (uVar7 <= (pSVar1->_buffer)._capacity) {
            (this->super_BaseAssembler)._bufferPtr = __s;
            uVar14 = (pSVar1->_buffer)._size;
            if (uVar7 < uVar14) {
              uVar7 = uVar14;
            }
            (pSVar1->_buffer)._size = uVar7;
            goto LAB_0012a700;
          }
          align();
          EVar4 = extraout_EAX;
LAB_0012a7f1:
          EVar4 = BaseEmitter::reportError((BaseEmitter *)this,EVar4,(char *)0x0);
          if (EVar4 != 0) {
            return EVar4;
          }
        } while( true );
      }
    }
    EVar4 = 2;
  }
  EVar4 = BaseEmitter::reportError((BaseEmitter *)this,EVar4,(char *)0x0);
  return EVar4;
}

Assistant:

Error Assembler::align(uint32_t alignMode, uint32_t alignment) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (ASMJIT_UNLIKELY(alignMode >= kAlignCount))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (alignment <= 1)
    return kErrorOk;

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(alignment) || alignment > Globals::kMaxAlignment))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t i = uint32_t(Support::alignUpDiff<size_t>(offset(), alignment));
  if (i > 0) {
    CodeWriter writer(this);
    ASMJIT_PROPAGATE(writer.ensureSpace(this, i));

    uint8_t pattern = 0x00;
    switch (alignMode) {
      case kAlignCode: {
        if (hasEncodingOption(kEncodingOptionOptimizedAlign)) {
          // Intel 64 and IA-32 Architectures Software Developer's Manual - Volume 2B (NOP).
          enum { kMaxNopSize = 9 };

          static const uint8_t nopData[kMaxNopSize][kMaxNopSize] = {
            { 0x90 },
            { 0x66, 0x90 },
            { 0x0F, 0x1F, 0x00 },
            { 0x0F, 0x1F, 0x40, 0x00 },
            { 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x44, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x80, 0x00, 0x00, 0x00, 0x00 },
            { 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 },
            { 0x66, 0x0F, 0x1F, 0x84, 0x00, 0x00, 0x00, 0x00, 0x00 }
          };

          do {
            uint32_t n = Support::min<uint32_t>(i, kMaxNopSize);
            const uint8_t* src = nopData[n - 1];

            i -= n;
            do {
              writer.emit8(*src++);
            } while (--n);
          } while (i);
        }

        pattern = 0x90;
        break;
      }

      case kAlignData:
        pattern = 0xCC;
        break;

      case kAlignZero:
        // Pattern already set to zero.
        break;
    }

    while (i) {
      writer.emit8(pattern);
      i--;
    }

    writer.done(this);
  }

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<128> sb;
    sb.appendChars(' ', _logger->indentation(FormatOptions::kIndentationCode));
    sb.appendFormat("align %u\n", alignment);
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}